

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

void __thiscall llvm::cl::Option::removeArgument(Option *this)

{
  atomic<void_*> aVar1;
  void **ppvVar2;
  bool bVar3;
  uint *puVar4;
  uint *puVar5;
  SubCommand *in_RDX;
  SubCommand *extraout_RDX;
  SubCommand *extraout_RDX_00;
  SubCommand *extraout_RDX_01;
  SubCommand *pSVar6;
  SubCommand *extraout_RDX_02;
  SubCommand *extraout_RDX_03;
  SubCommand *extraout_RDX_04;
  void **ppvVar7;
  uint *puVar8;
  iterator __begin4;
  SmallPtrSetIteratorImpl local_50;
  SmallPtrSetIteratorImpl local_40;
  
  if (GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
    ManagedStaticBase::RegisterManagedStatic
              (&GlobalParser.super_ManagedStaticBase,
               object_creator<(anonymous_namespace)::CommandLineParser>::call,
               object_deleter<(anonymous_namespace)::CommandLineParser>::call);
    in_RDX = extraout_RDX;
  }
  aVar1._M_b._M_p = GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p;
  if ((this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
      NumNonEmpty ==
      (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
      NumTombstones) {
    if (TopLevelSubCommand == (Option *)0x0) {
      ManagedStaticBase::RegisterManagedStatic
                ((ManagedStaticBase *)&TopLevelSubCommand,object_creator<llvm::cl::SubCommand>::call
                 ,object_deleter<llvm::cl::SubCommand>::call);
      in_RDX = extraout_RDX_00;
    }
    anon_unknown.dwarf_e8615::CommandLineParser::removeOption
              ((CommandLineParser *)this,TopLevelSubCommand,in_RDX);
    return;
  }
  bVar3 = any_of<llvm::SmallPtrSet<llvm::cl::SubCommand*,4u>const&,llvm::cl::Option::isInAllSubCommands()const::_lambda(llvm::cl::SubCommand_const*)_1_>
                    (&this->Subs);
  if (bVar3) {
    local_40.Bucket = *(void ***)((long)aVar1._M_b._M_p + 0xf0);
    puVar4 = (uint *)((long)aVar1._M_b._M_p + 0xf8);
    if (local_40.Bucket == *(void ***)((long)aVar1._M_b._M_p + 0xe8)) {
      puVar4 = (uint *)((long)aVar1._M_b._M_p + 0xfc);
    }
    local_40.End = local_40.Bucket + *puVar4;
    SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_40);
    ppvVar7 = local_40.Bucket;
    local_50.Bucket = local_40.Bucket;
    local_50.End = local_40.End;
    puVar4 = (uint *)((long)aVar1._M_b._M_p + 0xf8);
    if (*(long *)((long)aVar1._M_b._M_p + 0xf0) == *(long *)((long)aVar1._M_b._M_p + 0xe8)) {
      puVar4 = (uint *)((long)aVar1._M_b._M_p + 0xfc);
    }
    local_40.Bucket = (void **)(*(long *)((long)aVar1._M_b._M_p + 0xf0) + (ulong)*puVar4 * 8);
    local_40.End = local_40.Bucket;
    SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_40);
    ppvVar2 = local_40.Bucket;
    if (ppvVar7 != local_40.Bucket) {
      pSVar6 = extraout_RDX_01;
      do {
        if (local_50.End <= ppvVar7) {
LAB_0013d895:
          __assert_fail("Bucket < End",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallPtrSet.h"
                        ,0x122,
                        "const PtrTy llvm::SmallPtrSetIterator<llvm::cl::SubCommand *>::operator*() const [PtrTy = llvm::cl::SubCommand *]"
                       );
        }
        anon_unknown.dwarf_e8615::CommandLineParser::removeOption
                  ((CommandLineParser *)this,(Option *)*ppvVar7,pSVar6);
        local_50.Bucket = local_50.Bucket + 1;
        SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_50);
        pSVar6 = extraout_RDX_02;
        ppvVar7 = local_50.Bucket;
      } while (local_50.Bucket != ppvVar2);
    }
  }
  else {
    local_40.Bucket =
         (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
         CurArray;
    puVar4 = &(this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
              NumNonEmpty;
    puVar8 = &(this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
              CurArraySize;
    puVar5 = puVar8;
    if (local_40.Bucket ==
        (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
        SmallArray) {
      puVar5 = puVar4;
    }
    local_40.End = local_40.Bucket + *puVar5;
    SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_40);
    ppvVar7 = local_40.Bucket;
    local_50.Bucket = local_40.Bucket;
    local_50.End = local_40.End;
    local_40.Bucket =
         (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
         CurArray;
    if (local_40.Bucket ==
        (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
        SmallArray) {
      puVar8 = puVar4;
    }
    local_40.Bucket = local_40.Bucket + *puVar8;
    local_40.End = local_40.Bucket;
    SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_40);
    ppvVar2 = local_40.Bucket;
    if (ppvVar7 != local_40.Bucket) {
      pSVar6 = extraout_RDX_03;
      do {
        if (local_50.End <= ppvVar7) goto LAB_0013d895;
        anon_unknown.dwarf_e8615::CommandLineParser::removeOption
                  ((CommandLineParser *)this,(Option *)*ppvVar7,pSVar6);
        local_50.Bucket = local_50.Bucket + 1;
        SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_50);
        pSVar6 = extraout_RDX_04;
        ppvVar7 = local_50.Bucket;
      } while (local_50.Bucket != ppvVar2);
    }
  }
  return;
}

Assistant:

void Option::removeArgument() { GlobalParser->removeOption(this); }